

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::hex_int(spec *s)

{
  hexdig *in_RDI;
  char_type c;
  hexdig *this;
  hexdig *args_1;
  hexdig *in_stack_fffffffffffffee8;
  hexdig *in_stack_fffffffffffffef0;
  scanner_base in_stack_fffffffffffffef8;
  scanner_base in_stack_ffffffffffffff00;
  spec *in_stack_ffffffffffffff28;
  hexdig *in_stack_ffffffffffffff30;
  
  this = in_RDI;
  literal::literal<3ul>((literal *)in_RDI,(char (*) [3])in_RDI);
  c = (char_type)((ulong)in_RDI >> 0x38);
  hexdig::hexdig(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  hexdig::hexdig(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  character::character((character *)this,c);
  args_1 = (hexdig *)&stack0xfffffffffffffef8;
  hexdig::hexdig(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  sequence::sequence<toml::detail::character,toml::detail::syntax::hexdig>
            ((sequence *)in_stack_fffffffffffffef0,(character *)in_stack_fffffffffffffee8,args_1);
  either::either<toml::detail::syntax::hexdig,toml::detail::sequence>
            ((either *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(sequence *)args_1);
  repeat_at_least::repeat_at_least<toml::detail::either>
            ((repeat_at_least *)in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8,
             (either *)args_1);
  sequence::
  sequence<toml::detail::literal,toml::detail::syntax::hexdig,toml::detail::repeat_at_least>
            ((sequence *)in_stack_ffffffffffffff00._vptr_scanner_base,
             (literal *)in_stack_fffffffffffffef8._vptr_scanner_base,in_stack_fffffffffffffef0,
             (repeat_at_least *)in_stack_fffffffffffffee8);
  repeat_at_least::~repeat_at_least((repeat_at_least *)this);
  either::~either((either *)this);
  sequence::~sequence((sequence *)this);
  hexdig::~hexdig(this);
  character::~character((character *)0x676354);
  hexdig::~hexdig(this);
  hexdig::~hexdig(this);
  literal::~literal((literal *)0x67637b);
  return (sequence *)this;
}

Assistant:

TOML11_INLINE sequence hex_int(const spec& s)
{
    return sequence(
            literal("0x"),
            hexdig(s),
            repeat_at_least(0,
                either(
                    hexdig(s),
                    sequence(character(char_type('_')), hexdig(s))
                )
            )
        );
}